

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereIndexExprTransColumn(Walker *p,Expr *pExpr)

{
  IdxExprTrans *pTrans;
  char cVar1;
  IdxExprTrans *pX;
  Expr *pExpr_local;
  Walker *p_local;
  
  if (((pExpr->op == 0xa7) && (pTrans = (p->u).pIdxTrans, pExpr->iTable == pTrans->iTabCur)) &&
     ((int)pExpr->iColumn == pTrans->iTabCol)) {
    preserveExpr(pTrans,pExpr);
    cVar1 = sqlite3TableColumnAffinity((pExpr->y).pTab,(int)pExpr->iColumn);
    pExpr->affExpr = cVar1;
    pExpr->iTable = pTrans->iIdxCur;
    pExpr->iColumn = (ynVar)pTrans->iIdxCol;
    (pExpr->y).pTab = (Table *)0x0;
  }
  return 0;
}

Assistant:

static int whereIndexExprTransColumn(Walker *p, Expr *pExpr){
  if( pExpr->op==TK_COLUMN ){
    IdxExprTrans *pX = p->u.pIdxTrans;
    if( pExpr->iTable==pX->iTabCur && pExpr->iColumn==pX->iTabCol ){
      assert( ExprUseYTab(pExpr) && pExpr->y.pTab!=0 );
      preserveExpr(pX, pExpr);
      pExpr->affExpr = sqlite3TableColumnAffinity(pExpr->y.pTab,pExpr->iColumn);
      pExpr->iTable = pX->iIdxCur;
      pExpr->iColumn = pX->iIdxCol;
      pExpr->y.pTab = 0;
    }
  }
  return WRC_Continue;
}